

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsRandomShaderCase.cpp
# Opt level: O2

TextureCube * __thiscall deqp::gls::RandomShaderCase::getTexCube(RandomShaderCase *this)

{
  GLenum err;
  int iVar1;
  TextureCube *pTVar2;
  long lVar3;
  Vec4 (*minVal) [2];
  int face;
  long lVar4;
  
  pTVar2 = this->m_texCube;
  if (pTVar2 == (TextureCube *)0x0) {
    pTVar2 = (TextureCube *)operator_new(0x180);
    glu::TextureCube::TextureCube(pTVar2,this->m_renderCtx,0x1908,0x1401,0x10);
    this->m_texCube = pTVar2;
    if (getTexCube()::gradients == '\0') {
      iVar1 = __cxa_guard_acquire(&getTexCube()::gradients);
      if (iVar1 != 0) {
        getTexCube::gradients[0][0].m_data[0] = _DAT_018011a0;
        getTexCube::gradients[0][0].m_data[1] = _UNK_018011a4;
        getTexCube::gradients[0][0].m_data[2] = _UNK_018011a8;
        getTexCube::gradients[0][0].m_data[3] = _UNK_018011ac;
        getTexCube::gradients[0][1].m_data[0] = _DAT_01801120;
        getTexCube::gradients[0][1].m_data[1] = _UNK_01801124;
        getTexCube::gradients[0][1].m_data[2] = _UNK_01801128;
        getTexCube::gradients[0][1].m_data[3] = _UNK_0180112c;
        getTexCube::gradients[1][0].m_data[0] = _DAT_018011b0;
        getTexCube::gradients[1][0].m_data[1] = _UNK_018011b4;
        getTexCube::gradients[1][0].m_data[2] = _UNK_018011b8;
        getTexCube::gradients[1][0].m_data[3] = _UNK_018011bc;
        getTexCube::gradients[1][1].m_data[0] = _DAT_01801120;
        getTexCube::gradients[1][1].m_data[1] = _UNK_01801124;
        getTexCube::gradients[1][1].m_data[2] = _UNK_01801128;
        getTexCube::gradients[1][1].m_data[3] = _UNK_0180112c;
        getTexCube::gradients[2][0].m_data[0] = _DAT_018011c0;
        getTexCube::gradients[2][0].m_data[1] = _UNK_018011c4;
        getTexCube::gradients[2][0].m_data[2] = _UNK_018011c8;
        getTexCube::gradients[2][0].m_data[3] = _UNK_018011cc;
        getTexCube::gradients[2][1].m_data[0] = _DAT_01801120;
        getTexCube::gradients[2][1].m_data[1] = _UNK_01801124;
        getTexCube::gradients[2][1].m_data[2] = _UNK_01801128;
        getTexCube::gradients[2][1].m_data[3] = _UNK_0180112c;
        getTexCube::gradients[3][0].m_data[0] = _DAT_018011d0;
        getTexCube::gradients[3][0].m_data[1] = _UNK_018011d4;
        getTexCube::gradients[3][0].m_data[2] = _UNK_018011d8;
        getTexCube::gradients[3][0].m_data[3] = _UNK_018011dc;
        getTexCube::gradients[3][1].m_data[0] = _DAT_01801120;
        getTexCube::gradients[3][1].m_data[1] = _UNK_01801124;
        getTexCube::gradients[3][1].m_data[2] = _UNK_01801128;
        getTexCube::gradients[3][1].m_data[3] = _UNK_0180112c;
        getTexCube::gradients[4][0].m_data[0] = _DAT_018011e0;
        getTexCube::gradients[4][0].m_data[1] = _UNK_018011e4;
        getTexCube::gradients[4][0].m_data[2] = _UNK_018011e8;
        getTexCube::gradients[4][0].m_data[3] = _UNK_018011ec;
        getTexCube::gradients[4][1].m_data[0] = _DAT_01675840;
        getTexCube::gradients[4][1].m_data[1] = _UNK_01675844;
        getTexCube::gradients[4][1].m_data[2] = _UNK_01675848;
        getTexCube::gradients[4][1].m_data[3] = _UNK_0167584c;
        getTexCube::gradients[5][0].m_data[0] = _DAT_018011f0;
        getTexCube::gradients[5][0].m_data[1] = _UNK_018011f4;
        getTexCube::gradients[5][0].m_data[2] = _UNK_018011f8;
        getTexCube::gradients[5][0].m_data[3] = _UNK_018011fc;
        getTexCube::gradients[5][1].m_data[0] = _DAT_01801120;
        getTexCube::gradients[5][1].m_data[1] = _UNK_01801124;
        getTexCube::gradients[5][1].m_data[2] = _UNK_01801128;
        getTexCube::gradients[5][1].m_data[3] = _UNK_0180112c;
        __cxa_guard_release(&getTexCube()::gradients);
      }
    }
    minVal = getTexCube::gradients;
    lVar3 = 0;
    for (lVar4 = 0; lVar4 != 6; lVar4 = lVar4 + 1) {
      tcu::TextureCube::allocLevel(&this->m_texCube->m_refTexture,(CubeFace)lVar4,0);
      tcu::fillWithComponentGradients
                (*(PixelBufferAccess **)
                  ((long)&(this->m_texCube->m_refTexture).m_access[0].
                          super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar3),*minVal,
                 (Vec4 *)((long)minVal + 0x10));
      lVar3 = lVar3 + 0x18;
      minVal = (Vec4 (*) [2])((long)minVal + 0x20);
    }
    glu::TextureCube::upload(this->m_texCube);
    glwBindTexture(0x8513,this->m_texCube->m_glTexture);
    glwTexParameteri(0x8513,0x2802,0x812f);
    glwTexParameteri(0x8513,0x2803,0x812f);
    glwTexParameteri(0x8513,0x2801,0x2601);
    glwTexParameteri(0x8513,0x2800,0x2601);
    err = glwGetError();
    glu::checkError(err,(char *)0x0,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsRandomShaderCase.cpp"
                    ,0x15d);
    pTVar2 = this->m_texCube;
  }
  return pTVar2;
}

Assistant:

const glu::TextureCube* RandomShaderCase::getTexCube (void)
{
	if (!m_texCube)
	{
		m_texCube = new glu::TextureCube(m_renderCtx, TEXTURE_CUBE_FORMAT, TEXTURE_CUBE_DATA_TYPE, TEXTURE_CUBE_SIZE);

		static const tcu::Vec4 gradients[tcu::CUBEFACE_LAST][2] =
		{
			{ tcu::Vec4(-1.0f, -1.0f, -1.0f, 2.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f) }, // negative x
			{ tcu::Vec4( 0.0f, -1.0f, -1.0f, 2.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f) }, // positive x
			{ tcu::Vec4(-1.0f,  0.0f, -1.0f, 2.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f) }, // negative y
			{ tcu::Vec4(-1.0f, -1.0f,  0.0f, 2.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f) }, // positive y
			{ tcu::Vec4(-1.0f, -1.0f, -1.0f, 0.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f) }, // negative z
			{ tcu::Vec4( 0.0f,  0.0f,  0.0f, 2.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f) }  // positive z
		};

		// Fill level 0.
		for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
		{
			m_texCube->getRefTexture().allocLevel((tcu::CubeFace)face, 0);
			tcu::fillWithComponentGradients(m_texCube->getRefTexture().getLevelFace(0, (tcu::CubeFace)face), gradients[face][0], gradients[face][1]);
		}

		m_texCube->upload();

		// Setup parameters.
		glBindTexture(GL_TEXTURE_CUBE_MAP, m_texCube->getGLTexture());
		glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_S,		TEXTURE_WRAP_S);
		glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_T,		TEXTURE_WRAP_T);
		glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER,	TEXTURE_MIN_FILTER);
		glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER,	TEXTURE_MAG_FILTER);

		GLU_CHECK();
	}

	return m_texCube;
}